

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O0

void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  mz_zip_internal_state *pmVar4;
  undefined4 *puVar5;
  void *pvVar6;
  void *pvVar7;
  uint uVar8;
  uint uVar9;
  mz_zip_array *pmVar10;
  long lVar11;
  ulong uVar12;
  mz_uint8 *pmVar13;
  bool bVar14;
  uint local_1e4;
  uint local_1c4;
  bool local_1b2;
  uint local_1a4;
  uint local_184;
  bool local_171;
  mz_uint32 t_2;
  mz_uint32 t_1;
  mz_uint64 root_1;
  mz_uint64 child_1;
  ulong uStack_150;
  mz_uint32 t;
  mz_uint64 root;
  mz_uint64 child;
  uint local_138;
  mz_uint32 size;
  mz_uint32 end;
  mz_uint32 start;
  mz_uint32 *pIndices;
  mz_zip_array *pCentral_dir;
  mz_zip_array *pCentral_dir_offsets;
  mz_zip_internal_state *pState;
  mz_zip_archive *pZip_local;
  mz_uint8 r_3;
  mz_uint8 l_3;
  mz_uint r_len_3;
  mz_uint l_len_3;
  mz_uint8 *pR_3;
  mz_uint8 *pE_3;
  mz_uint8 *pL_3;
  byte local_c2;
  byte local_c1;
  mz_uint8 r_2;
  mz_uint8 l_2;
  mz_uint r_len_2;
  mz_uint l_len_2;
  mz_uint8 *pR_2;
  mz_uint8 *pE_2;
  mz_uint8 *pL_2;
  byte local_82;
  byte local_81;
  mz_uint8 r_1;
  mz_uint8 l_1;
  mz_uint r_len_1;
  mz_uint l_len_1;
  mz_uint8 *pR_1;
  mz_uint8 *pE_1;
  mz_uint8 *pL_1;
  byte local_42;
  byte local_41;
  mz_uint8 r;
  mz_uint8 l;
  mz_uint r_len;
  mz_uint l_len;
  mz_uint8 *pR;
  mz_uint8 *pE;
  mz_uint8 *pL;
  
  pmVar4 = pZip->m_pState;
  pmVar10 = &pmVar4->m_central_dir_offsets;
  local_138 = pZip->m_total_files;
  if (local_138 < 2) {
    return;
  }
  puVar5 = (undefined4 *)(pmVar4->m_sorted_central_dir_offsets).m_p;
  size = local_138 - 2 >> 1;
  do {
    uStack_150 = (ulong)size;
    while( true ) {
      lVar11 = uStack_150 * 2;
      uVar12 = lVar11 + 1;
      if (local_138 <= uVar12) break;
      local_171 = false;
      if (lVar11 + 2U < (ulong)local_138) {
        pvVar6 = (pmVar4->m_central_dir).m_p;
        uVar2 = *(uint *)((long)pmVar10->m_p + (ulong)(uint)puVar5[uVar12] * 4);
        pvVar7 = (pmVar4->m_central_dir).m_p;
        uVar3 = *(uint *)((long)pmVar10->m_p + (ulong)(uint)puVar5[lVar11 + 2] * 4);
        uVar8 = (uint)*(ushort *)((long)pvVar6 + (ulong)uVar2 + 0x1c);
        uVar9 = (uint)*(ushort *)((long)pvVar7 + (ulong)uVar3 + 0x1c);
        local_41 = 0;
        local_42 = 0;
        pE = (mz_uint8 *)((long)pvVar6 + (ulong)uVar2 + 0x2e);
        _r_len = (byte *)((long)pvVar7 + (ulong)uVar3 + 0x2e);
        local_184 = uVar9;
        if (uVar8 < uVar9) {
          local_184 = uVar8;
        }
        pmVar13 = pE + local_184;
        for (; pE < pmVar13; pE = pE + 1) {
          if ((*pE < 0x41) || (0x5a < *pE)) {
            local_41 = *pE;
          }
          else {
            local_41 = *pE + 0x20;
          }
          if ((*_r_len < 0x41) || (0x5a < *_r_len)) {
            local_42 = *_r_len;
          }
          else {
            local_42 = *_r_len + 0x20;
          }
          if (local_41 != local_42) break;
          _r_len = _r_len + 1;
        }
        if (pE == pmVar13) {
          local_171 = uVar8 < uVar9;
        }
        else {
          local_171 = local_41 < local_42;
        }
      }
      uVar12 = local_171 + uVar12;
      pvVar6 = (pmVar4->m_central_dir).m_p;
      uVar2 = *(uint *)((long)pmVar10->m_p + (ulong)(uint)puVar5[uStack_150] * 4);
      pvVar7 = (pmVar4->m_central_dir).m_p;
      uVar3 = *(uint *)((long)pmVar10->m_p + (ulong)(uint)puVar5[uVar12] * 4);
      uVar8 = (uint)*(ushort *)((long)pvVar6 + (ulong)uVar2 + 0x1c);
      uVar9 = (uint)*(ushort *)((long)pvVar7 + (ulong)uVar3 + 0x1c);
      local_81 = 0;
      local_82 = 0;
      pE_1 = (mz_uint8 *)((long)pvVar6 + (ulong)uVar2 + 0x2e);
      _r_len_1 = (byte *)((long)pvVar7 + (ulong)uVar3 + 0x2e);
      local_1a4 = uVar9;
      if (uVar8 < uVar9) {
        local_1a4 = uVar8;
      }
      pmVar13 = pE_1 + local_1a4;
      for (; pE_1 < pmVar13; pE_1 = pE_1 + 1) {
        if ((*pE_1 < 0x41) || (0x5a < *pE_1)) {
          local_81 = *pE_1;
        }
        else {
          local_81 = *pE_1 + 0x20;
        }
        if ((*_r_len_1 < 0x41) || (0x5a < *_r_len_1)) {
          local_82 = *_r_len_1;
        }
        else {
          local_82 = *_r_len_1 + 0x20;
        }
        if (local_81 != local_82) break;
        _r_len_1 = _r_len_1 + 1;
      }
      if (pE_1 == pmVar13) {
        bVar14 = uVar8 < uVar9;
      }
      else {
        bVar14 = local_81 < local_82;
      }
      if (!bVar14) break;
      uVar1 = puVar5[uStack_150];
      puVar5[uStack_150] = puVar5[uVar12];
      puVar5[uVar12] = uVar1;
      uStack_150 = uVar12;
    }
    if (size == 0) {
      do {
        local_138 = local_138 - 1;
        if (local_138 == 0) {
          return;
        }
        _t_2 = 0;
        uVar1 = puVar5[local_138];
        puVar5[local_138] = *puVar5;
        *puVar5 = uVar1;
        while( true ) {
          lVar11 = _t_2 * 2;
          uVar12 = lVar11 + 1;
          if (local_138 <= uVar12) break;
          local_1b2 = false;
          if (lVar11 + 2U < (ulong)local_138) {
            pvVar6 = (pmVar4->m_central_dir).m_p;
            uVar2 = *(uint *)((long)pmVar10->m_p + (ulong)(uint)puVar5[uVar12] * 4);
            pvVar7 = (pmVar4->m_central_dir).m_p;
            uVar3 = *(uint *)((long)pmVar10->m_p + (ulong)(uint)puVar5[lVar11 + 2] * 4);
            uVar8 = (uint)*(ushort *)((long)pvVar6 + (ulong)uVar2 + 0x1c);
            uVar9 = (uint)*(ushort *)((long)pvVar7 + (ulong)uVar3 + 0x1c);
            local_c1 = 0;
            local_c2 = 0;
            pE_2 = (mz_uint8 *)((long)pvVar6 + (ulong)uVar2 + 0x2e);
            _r_len_2 = (byte *)((long)pvVar7 + (ulong)uVar3 + 0x2e);
            local_1c4 = uVar9;
            if (uVar8 < uVar9) {
              local_1c4 = uVar8;
            }
            pmVar13 = pE_2 + local_1c4;
            for (; pE_2 < pmVar13; pE_2 = pE_2 + 1) {
              if ((*pE_2 < 0x41) || (0x5a < *pE_2)) {
                local_c1 = *pE_2;
              }
              else {
                local_c1 = *pE_2 + 0x20;
              }
              if ((*_r_len_2 < 0x41) || (0x5a < *_r_len_2)) {
                local_c2 = *_r_len_2;
              }
              else {
                local_c2 = *_r_len_2 + 0x20;
              }
              if (local_c1 != local_c2) break;
              _r_len_2 = _r_len_2 + 1;
            }
            if (pE_2 == pmVar13) {
              local_1b2 = uVar8 < uVar9;
            }
            else {
              local_1b2 = local_c1 < local_c2;
            }
          }
          lVar11 = local_1b2 + uVar12;
          pvVar6 = (pmVar4->m_central_dir).m_p;
          uVar2 = *(uint *)((long)pmVar10->m_p + (ulong)(uint)puVar5[_t_2] * 4);
          pvVar7 = (pmVar4->m_central_dir).m_p;
          uVar3 = *(uint *)((long)pmVar10->m_p + (ulong)(uint)puVar5[lVar11] * 4);
          uVar8 = (uint)*(ushort *)((long)pvVar6 + (ulong)uVar2 + 0x1c);
          uVar9 = (uint)*(ushort *)((long)pvVar7 + (ulong)uVar3 + 0x1c);
          pZip_local._7_1_ = 0;
          pZip_local._6_1_ = 0;
          pE_3 = (mz_uint8 *)((long)pvVar6 + (ulong)uVar2 + 0x2e);
          _r_len_3 = (byte *)((long)pvVar7 + (ulong)uVar3 + 0x2e);
          local_1e4 = uVar9;
          if (uVar8 < uVar9) {
            local_1e4 = uVar8;
          }
          pmVar13 = pE_3 + local_1e4;
          for (; pE_3 < pmVar13; pE_3 = pE_3 + 1) {
            if ((*pE_3 < 0x41) || (0x5a < *pE_3)) {
              pZip_local._7_1_ = *pE_3;
            }
            else {
              pZip_local._7_1_ = *pE_3 + 0x20;
            }
            if ((*_r_len_3 < 0x41) || (0x5a < *_r_len_3)) {
              pZip_local._6_1_ = *_r_len_3;
            }
            else {
              pZip_local._6_1_ = *_r_len_3 + 0x20;
            }
            if (pZip_local._7_1_ != pZip_local._6_1_) break;
            _r_len_3 = _r_len_3 + 1;
          }
          if (pE_3 == pmVar13) {
            bVar14 = uVar8 < uVar9;
          }
          else {
            bVar14 = pZip_local._7_1_ < pZip_local._6_1_;
          }
          if (!bVar14) break;
          uVar1 = puVar5[_t_2];
          puVar5[_t_2] = puVar5[lVar11];
          puVar5[lVar11] = uVar1;
          _t_2 = lVar11;
        }
      } while( true );
    }
    size = size - 1;
  } while( true );
}

Assistant:

static void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)
{
    mz_zip_internal_state *pState = pZip->m_pState;
    const mz_zip_array *pCentral_dir_offsets = &pState->m_central_dir_offsets;
    const mz_zip_array *pCentral_dir = &pState->m_central_dir;
    mz_uint32 *pIndices;
    mz_uint32 start, end;
    const mz_uint32 size = pZip->m_total_files;

    if (size <= 1U)
        return;

    pIndices = &MZ_ZIP_ARRAY_ELEMENT(&pState->m_sorted_central_dir_offsets, mz_uint32, 0);

    start = (size - 2U) >> 1U;
    for (;;)
    {
        mz_uint64 child, root = start;
        for (;;)
        {
            if ((child = (root << 1U) + 1U) >= size)
                break;
            child += (((child + 1U) < size) && (mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[child], pIndices[child + 1U])));
            if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
                break;
            MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
            root = child;
        }
        if (!start)
            break;
        start--;
    }

    end = size - 1;
    while (end > 0)
    {
        mz_uint64 child, root = 0;
        MZ_SWAP_UINT32(pIndices[end], pIndices[0]);
        for (;;)
        {
            if ((child = (root << 1U) + 1U) >= end)
                break;
            child += (((child + 1U) < end) && mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[child], pIndices[child + 1U]));
            if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
                break;
            MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
            root = child;
        }
        end--;
    }
}